

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp,stbi_uc *two_back
                             )

{
  stbi_uc *psVar1;
  bool bVar2;
  stbi_uc sVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  stbi_uc *psVar13;
  stbi_uc *psVar14;
  char *pcVar15;
  stbi_uc *psVar16;
  byte *pbVar17;
  byte bVar18;
  int iVar19;
  undefined4 in_register_0000000c;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint n;
  uint uVar23;
  stbi__context *unaff_R13;
  size_t __size;
  bool bVar24;
  uint local_94;
  uint local_8c;
  stbi__context *local_80;
  
  psVar1 = g->out;
  if (psVar1 == (stbi_uc *)0x0) {
    iVar7 = stbi__gif_header(s,g,comp,0);
    if (iVar7 == 0) {
      return (stbi_uc *)0x0;
    }
    iVar7 = g->w;
    iVar8 = g->h;
    iVar9 = stbi__mad3sizes_valid(4,iVar7,iVar8,0);
    if (iVar9 == 0) {
      pcVar15 = "too large";
    }
    else {
      iVar8 = iVar8 * iVar7;
      __size = (size_t)(iVar8 * 4);
      unaff_R13 = (stbi__context *)malloc(__size);
      g->out = (stbi_uc *)unaff_R13;
      psVar13 = (stbi_uc *)malloc(__size);
      g->background = psVar13;
      psVar14 = (stbi_uc *)malloc((long)iVar8);
      g->history = psVar14;
      pcVar15 = "outofmem";
      if ((unaff_R13 != (stbi__context *)0x0) &&
         (psVar14 != (stbi_uc *)0x0 && psVar13 != (stbi_uc *)0x0)) {
        memset(unaff_R13,0,__size);
        memset(psVar13,0,__size);
        memset(psVar14,0,(long)iVar8);
        goto LAB_00180166;
      }
    }
    unaff_R13 = (stbi__context *)0x0;
    stbi__g_failure_reason = pcVar15;
  }
  else {
    uVar22 = (uint)g->eflags >> 2 & 7;
    uVar6 = g->h * g->w;
    uVar12 = 2;
    if (uVar22 != 3) {
      uVar12 = uVar22;
    }
    if (CONCAT44(in_register_0000000c,req_comp) != 0) {
      uVar12 = uVar22;
    }
    if (uVar12 == 3) {
      if (0 < (int)uVar6) {
        uVar20 = 0;
        do {
          if (g->history[uVar20] != '\0') {
            *(undefined4 *)(g->out + uVar20 * 4) =
                 *(undefined4 *)(CONCAT44(in_register_0000000c,req_comp) + uVar20 * 4);
          }
          uVar20 = uVar20 + 1;
        } while (uVar6 != uVar20);
      }
    }
    else if ((uVar12 == 2) && (0 < (int)uVar6)) {
      uVar20 = 0;
      do {
        if (g->history[uVar20] != '\0') {
          *(undefined4 *)(g->out + uVar20 * 4) = *(undefined4 *)(g->background + uVar20 * 4);
        }
        uVar20 = uVar20 + 1;
      } while (uVar6 != uVar20);
    }
    memcpy(g->background,g->out,(long)g->h * (long)g->w * 4);
LAB_00180166:
    memset(g->history,0,(long)g->h * (long)g->w);
    psVar13 = s->buffer_start;
    psVar14 = s->buffer_start + 1;
    do {
      psVar16 = s->img_buffer;
      if (psVar16 < s->img_buffer_end) {
LAB_00180208:
        s->img_buffer = psVar16 + 1;
        sVar3 = *psVar16;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
          if (iVar7 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar13;
            s->img_buffer_end = psVar14;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar13;
            s->img_buffer_end = psVar13 + iVar7;
          }
          psVar16 = s->img_buffer;
          goto LAB_00180208;
        }
        sVar3 = '\0';
      }
      if (sVar3 == '!') {
        psVar16 = s->img_buffer;
        if (s->img_buffer_end <= psVar16) {
          if (s->read_from_callbacks == 0) goto LAB_00180b9f;
          iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
          if (iVar7 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar13;
            s->img_buffer_end = psVar14;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar13;
            s->img_buffer_end = psVar13 + iVar7;
          }
          psVar16 = s->img_buffer;
        }
        s->img_buffer = psVar16 + 1;
        if (*psVar16 != 0xf9) goto LAB_00180b9f;
        pbVar17 = s->img_buffer;
        if (pbVar17 < s->img_buffer_end) {
LAB_00180424:
          s->img_buffer = pbVar17 + 1;
          bVar4 = *pbVar17;
        }
        else {
          if (s->read_from_callbacks != 0) {
            iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
            if (iVar7 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar13;
              s->img_buffer_end = psVar14;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar13;
              s->img_buffer_end = psVar13 + iVar7;
            }
            pbVar17 = s->img_buffer;
            goto LAB_00180424;
          }
          bVar4 = 0;
        }
        if (bVar4 == 4) {
          pbVar17 = s->img_buffer;
          if (pbVar17 < s->img_buffer_end) {
LAB_001805c8:
            s->img_buffer = pbVar17 + 1;
            uVar12 = (uint)*pbVar17;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
              if (iVar7 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar13;
                s->img_buffer_end = psVar14;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar13;
                s->img_buffer_end = psVar13 + iVar7;
              }
              pbVar17 = s->img_buffer;
              goto LAB_001805c8;
            }
            uVar12 = 0;
          }
          g->eflags = uVar12;
          iVar7 = stbi__get16le(s);
          g->delay = iVar7 * 10;
          if (-1 < (long)g->transparent) {
            g->pal[g->transparent][3] = 0xff;
          }
          if ((g->eflags & 1) != 0) {
            pbVar17 = s->img_buffer;
            if (pbVar17 < s->img_buffer_end) {
LAB_00180b7a:
              s->img_buffer = pbVar17 + 1;
              bVar4 = *pbVar17;
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
                if (iVar7 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar13;
                  s->img_buffer_end = psVar14;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar13;
                  s->img_buffer_end = psVar13 + iVar7;
                }
                pbVar17 = s->img_buffer;
                goto LAB_00180b7a;
              }
              bVar4 = 0;
            }
            g->transparent = (uint)bVar4;
            g->pal[bVar4][3] = '\0';
            goto LAB_00180b9f;
          }
          if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0018061d:
            s->img_buffer = s->img_buffer + 1;
          }
          else {
            iVar7 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
            if (0 < iVar7) goto LAB_0018061d;
            s->img_buffer = s->img_buffer_end;
            (*(s->io).skip)(s->io_user_data,1 - iVar7);
          }
          g->transparent = -1;
LAB_00180b9f:
          do {
            pbVar17 = s->img_buffer;
            if (pbVar17 < s->img_buffer_end) {
LAB_00180c04:
              s->img_buffer = pbVar17 + 1;
              bVar4 = *pbVar17;
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
                if (iVar7 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar13;
                  s->img_buffer_end = psVar14;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar13;
                  s->img_buffer_end = psVar13 + iVar7;
                }
                pbVar17 = s->img_buffer;
                goto LAB_00180c04;
              }
              bVar4 = 0;
            }
            if (bVar4 == 0) goto LAB_00180c19;
            stbi__skip(s,(uint)bVar4);
          } while( true );
        }
        stbi__skip(s,(uint)bVar4);
LAB_00180c19:
        bVar24 = true;
      }
      else if (sVar3 == ';') {
        bVar24 = false;
        unaff_R13 = s;
      }
      else if (sVar3 == ',') {
        iVar7 = stbi__get16le(s);
        iVar8 = stbi__get16le(s);
        iVar9 = stbi__get16le(s);
        iVar10 = stbi__get16le(s);
        if ((g->w < iVar7 + iVar9) || (g->h < iVar10 + iVar8)) {
          stbi__g_failure_reason = "bad Image Descriptor";
        }
        else {
          iVar19 = g->w * 4;
          g->line_size = iVar19;
          g->start_x = iVar7 << 2;
          g->start_y = iVar8 * iVar19;
          g->max_x = (iVar7 + iVar9) * 4;
          iVar10 = iVar19 * (iVar10 + iVar8);
          g->max_y = iVar10;
          g->cur_x = iVar7 << 2;
          if (iVar9 != 0) {
            iVar10 = iVar8 * iVar19;
          }
          g->cur_y = iVar10;
          pbVar17 = s->img_buffer;
          if (pbVar17 < s->img_buffer_end) {
LAB_001804bc:
            s->img_buffer = pbVar17 + 1;
            uVar12 = (uint)*pbVar17;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
              if (iVar7 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar13;
                s->img_buffer_end = psVar14;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar13;
                s->img_buffer_end = psVar13 + iVar7;
              }
              pbVar17 = s->img_buffer;
              goto LAB_001804bc;
            }
            uVar12 = 0;
          }
          g->lflags = uVar12;
          if ((uVar12 & 0x40) == 0) {
            g->step = g->line_size;
            g->parse = 0;
          }
          else {
            g->step = g->line_size << 3;
            g->parse = 3;
          }
          if ((char)(byte)uVar12 < '\0') {
            iVar7 = -1;
            if ((g->eflags & 1) != 0) {
              iVar7 = g->transparent;
            }
            stbi__gif_parse_colortable(s,g->lpal,2 << ((byte)uVar12 & 7),iVar7);
            g->color_table = g->lpal[0];
          }
          else {
            if ((g->flags & 0x80) == 0) {
              stbi__g_failure_reason = "missing color table";
              goto LAB_001802e3;
            }
            g->color_table = g->pal[0];
          }
          pbVar17 = s->img_buffer;
          if (pbVar17 < s->img_buffer_end) {
LAB_001806b8:
            s->img_buffer = pbVar17 + 1;
            bVar4 = *pbVar17;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
              if (iVar7 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar13;
                s->img_buffer_end = psVar14;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar13;
                s->img_buffer_end = psVar13 + iVar7;
              }
              pbVar17 = s->img_buffer;
              goto LAB_001806b8;
            }
            bVar4 = 0;
          }
          if (bVar4 < 0xd) {
            uVar12 = 1 << (bVar4 & 0x1f);
            uVar20 = 0;
            do {
              g->codes[uVar20].prefix = -1;
              g->codes[uVar20].first = (stbi_uc)uVar20;
              g->codes[uVar20].suffix = (stbi_uc)uVar20;
              uVar20 = uVar20 + 1;
            } while (uVar12 != uVar20);
            uVar11 = (2 << (bVar4 & 0x1f)) - 1;
            local_94 = 0xffffffff;
            bVar24 = true;
            n = 0;
            iVar8 = 0;
            uVar22 = 0;
            uVar6 = uVar12 + 2;
            iVar7 = bVar4 + 1;
            local_8c = uVar11;
LAB_00180753:
            do {
              iVar9 = iVar8 - iVar7;
              if (iVar7 <= iVar8) {
                bVar18 = (byte)iVar7;
                uVar23 = uVar22 & local_8c;
                bVar2 = true;
                if (uVar23 == uVar12) {
                  uVar23 = 0xffffffff;
                  local_8c = uVar11;
                  iVar7 = bVar4 + 1;
                  local_94 = uVar12 + 2;
                  bVar24 = false;
                }
                else {
                  if (uVar23 == uVar12 + 1) {
                    do {
                      stbi__skip(s,n);
                      pbVar17 = s->img_buffer;
                      if (pbVar17 < s->img_buffer_end) {
LAB_00180936:
                        s->img_buffer = pbVar17 + 1;
                        bVar5 = *pbVar17;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
                          if (iVar8 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar13;
                            s->img_buffer_end = psVar14;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar13;
                            s->img_buffer_end = psVar13 + iVar8;
                          }
                          pbVar17 = s->img_buffer;
                          goto LAB_00180936;
                        }
                        bVar5 = 0;
                      }
                      if (bVar5 == 0) goto LAB_00180972;
                      n = (uint)bVar5;
                    } while( true );
                  }
                  if ((int)uVar6 < (int)uVar23) {
                    stbi__g_failure_reason = "illegal code in raster";
                  }
                  else if (bVar24) {
                    stbi__g_failure_reason = "no clear code";
                    bVar24 = true;
                  }
                  else {
                    if ((int)local_94 < 0) {
                      if (uVar23 != uVar6) goto LAB_00180a62;
                      stbi__g_failure_reason = "illegal code in raster";
                    }
                    else {
                      uVar21 = uVar6 + 1;
                      if ((int)uVar6 < 0x2000) {
                        g->codes[(int)uVar6].prefix = (stbi__int16)local_94;
                        sVar3 = g->codes[local_94].first;
                        g->codes[(int)uVar6].first = sVar3;
                        if (uVar23 != uVar21) {
                          sVar3 = g->codes[(int)uVar23].first;
                        }
                        g->codes[(int)uVar6].suffix = sVar3;
                        uVar6 = uVar21;
LAB_00180a62:
                        local_94 = uVar6;
                        stbi__out_gif_code(g,(stbi__uint16)uVar23);
                        bVar24 = (local_94 & local_8c) == 0;
                        iVar8 = iVar7 + 1;
                        if ((int)local_94 < 0x1000 && bVar24) {
                          iVar7 = iVar8;
                        }
                        if ((int)local_94 < 0x1000 && bVar24) {
                          local_8c = ~(-1 << ((byte)iVar8 & 0x1f));
                        }
                        bVar24 = false;
                        bVar2 = true;
                        goto LAB_001809bc;
                      }
                      stbi__g_failure_reason = "too many codes";
                      uVar6 = uVar21;
                    }
                    bVar24 = false;
                  }
                  bVar2 = false;
                  local_80 = (stbi__context *)0x0;
                  uVar23 = local_94;
                  local_94 = uVar6;
                }
                goto LAB_001809bc;
              }
              if (n == 0) {
                pbVar17 = s->img_buffer;
                if (pbVar17 < s->img_buffer_end) {
LAB_001807d0:
                  s->img_buffer = pbVar17 + 1;
                  bVar18 = *pbVar17;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
                    if (iVar9 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar13;
                      s->img_buffer_end = psVar14;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar13;
                      s->img_buffer_end = psVar13 + iVar9;
                    }
                    pbVar17 = s->img_buffer;
                    goto LAB_001807d0;
                  }
                  bVar18 = 0;
                }
                if (bVar18 == 0) {
                  local_80 = (stbi__context *)g->out;
                  goto LAB_00180ac8;
                }
                n = (uint)bVar18;
              }
              pbVar17 = s->img_buffer;
              if (pbVar17 < s->img_buffer_end) {
LAB_00180853:
                s->img_buffer = pbVar17 + 1;
                uVar23 = (uint)*pbVar17;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
                  if (iVar9 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar13;
                    s->img_buffer_end = psVar14;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar13;
                    s->img_buffer_end = psVar13 + iVar9;
                  }
                  pbVar17 = s->img_buffer;
                  goto LAB_00180853;
                }
                uVar23 = 0;
              }
              bVar18 = (byte)iVar8;
              n = n - 1;
              iVar8 = iVar8 + 8;
              uVar22 = uVar22 | uVar23 << (bVar18 & 0x1f);
            } while( true );
          }
          local_80 = (stbi__context *)0x0;
LAB_00180ac8:
          if (local_80 != (stbi__context *)0x0) {
            unaff_R13 = local_80;
            if (psVar1 == (stbi_uc *)0x0) {
              uVar12 = g->h * g->w;
              if ((int)uVar12 < 1 || g->bgindex < 1) {
                bVar24 = false;
              }
              else {
                uVar20 = 0;
                do {
                  if (g->history[uVar20] == '\0') {
                    g->pal[g->bgindex][3] = 0xff;
                    *(stbi_uc (*) [4])(g->out + uVar20 * 4) = g->pal[g->bgindex];
                  }
                  uVar20 = uVar20 + 1;
                  bVar24 = false;
                } while (uVar12 != uVar20);
              }
            }
            else {
              bVar24 = false;
            }
            goto LAB_00180c1b;
          }
        }
        bVar24 = false;
        unaff_R13 = (stbi__context *)0x0;
      }
      else {
        stbi__g_failure_reason = "unknown code";
LAB_001802e3:
        bVar24 = false;
        unaff_R13 = (stbi__context *)0x0;
      }
LAB_00180c1b:
    } while (bVar24);
  }
  return (stbi_uc *)unaff_R13;
LAB_00180972:
  local_80 = (stbi__context *)g->out;
  n = 0;
  bVar2 = false;
  uVar23 = local_94;
  local_94 = uVar6;
LAB_001809bc:
  iVar8 = iVar9;
  uVar22 = (int)uVar22 >> (bVar18 & 0x1f);
  uVar6 = local_94;
  local_94 = uVar23;
  if (!bVar2) goto LAB_00180ac8;
  goto LAB_00180753;
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp, stbi_uc *two_back)
{
   int dispose; 
   int first_frame; 
   int pi; 
   int pcount; 
   STBI_NOTUSED(req_comp);

   // on first frame, any non-written pixels get the background colour (non-transparent)
   first_frame = 0; 
   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0)) return 0; // stbi__g_failure_reason set by stbi__gif_header
      if (!stbi__mad3sizes_valid(4, g->w, g->h, 0))
         return stbi__errpuc("too large", "GIF image is too large");
      pcount = g->w * g->h;
      g->out = (stbi_uc *) stbi__malloc(4 * pcount);
      g->background = (stbi_uc *) stbi__malloc(4 * pcount);
      g->history = (stbi_uc *) stbi__malloc(pcount);
      if (!g->out || !g->background || !g->history)
         return stbi__errpuc("outofmem", "Out of memory");

      // image is treated as "transparent" at the start - ie, nothing overwrites the current background; 
      // background colour is only used for pixels that are not rendered first frame, after that "background"
      // color refers to the color that was there the previous frame. 
      memset(g->out, 0x00, 4 * pcount);
      memset(g->background, 0x00, 4 * pcount); // state of the background (starts transparent)
      memset(g->history, 0x00, pcount);        // pixels that were affected previous frame
      first_frame = 1; 
   } else {
      // second frame - how do we dispoase of the previous one?
      dispose = (g->eflags & 0x1C) >> 2; 
      pcount = g->w * g->h; 

      if ((dispose == 3) && (two_back == 0)) {
         dispose = 2; // if I don't have an image to revert back to, default to the old background
      }

      if (dispose == 3) { // use previous graphic
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &two_back[pi * 4], 4 ); 
            }
         }
      } else if (dispose == 2) { 
         // restore what was changed last frame to background before that frame; 
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &g->background[pi * 4], 4 ); 
            }
         }
      } else {
         // This is a non-disposal case eithe way, so just 
         // leave the pixels as is, and they will become the new background
         // 1: do not dispose
         // 0:  not specified.
      }

      // background is what out is after the undoing of the previou frame; 
      memcpy( g->background, g->out, 4 * g->w * g->h ); 
   }

   // clear my history; 
   memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame

   for (;;) {
      int tag = stbi__get8(s); 
      switch (tag) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            // if the width of the specified rectangle is 0, that means
            // we may not see *any* pixels or the image is malformed;
            // to make sure this is caught, move the current y down to
            // max_y (which is what out_gif_code checks).
            if (w == 0)
               g->cur_y = g->max_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");            
            
            o = stbi__process_gif_raster(s, g);
            if (!o) return NULL;

            // if this was the first frame, 
            pcount = g->w * g->h; 
            if (first_frame && (g->bgindex > 0)) {
               // if first frame, any pixel not drawn to gets the background color
               for (pi = 0; pi < pcount; ++pi) {
                  if (g->history[pi] == 0) {
                     g->pal[g->bgindex][3] = 255; // just in case it was made transparent, undo that; It will be reset next frame if need be; 
                     memcpy( &g->out[pi * 4], &g->pal[g->bgindex], 4 ); 
                  }
               }
            }

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            int ext = stbi__get8(s); 
            if (ext == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = 10 * stbi__get16le(s); // delay - 1/100th of a second, saving as 1/1000ths.

                  // unset old transparent
                  if (g->transparent >= 0) {
                     g->pal[g->transparent][3] = 255; 
                  } 
                  if (g->eflags & 0x01) {
                     g->transparent = stbi__get8(s);
                     if (g->transparent >= 0) {
                        g->pal[g->transparent][3] = 0; 
                     }
                  } else {
                     // don't need transparent
                     stbi__skip(s, 1); 
                     g->transparent = -1; 
                  }
               } else {
                  stbi__skip(s, len);
                  break;
               }
            } 
            while ((len = stbi__get8(s)) != 0) {
               stbi__skip(s, len);
            }
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}